

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_58494::ParserImpl::GetOpPriority(ParserImpl *this,TokenDetail *t)

{
  int iVar1;
  TokenDetail *t_local;
  ParserImpl *this_local;
  
  iVar1 = t->token_;
  if ((iVar1 != 0x25) && (iVar1 != 0x2a)) {
    if ((iVar1 == 0x2b) || (iVar1 == 0x2d)) {
      return 0x46;
    }
    if (iVar1 != 0x2f) {
      if ((iVar1 != 0x3c) && (iVar1 != 0x3e)) {
        if (iVar1 == 0x5e) {
          return 100;
        }
        if (iVar1 == 0x100) {
          return 0x28;
        }
        if (iVar1 == 0x10e) {
          return 0x1e;
        }
        if (3 < iVar1 - 0x118U) {
          if (iVar1 != 0x11c) {
            return 0;
          }
          return 0x3c;
        }
      }
      return 0x32;
    }
  }
  return 0x50;
}

Assistant:

int GetOpPriority(const TokenDetail &t) const
        {
            switch (t.token_)
            {
                case '^':               return 100;
                case '*':
                case '/':
                case '%':               return 80;
                case '+':
                case '-':               return 70;
                case Token_Concat:      return 60;
                case '>':
                case '<':
                case Token_GreaterEqual:
                case Token_LessEqual:
                case Token_NotEqual:
                case Token_Equal:       return 50;
                case Token_And:         return 40;
                case Token_Or:          return 30;
                default:                return 0;
            }
        }